

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void save_dungeon_struct(memfile *mf,dungeon *dgn)

{
  dungeon *dgn_local;
  memfile *mf_local;
  
  mtag(mf,(long)dgn->ledger_start,MTAG_DUNGEONSTRUCT);
  mwrite(mf,dgn,0x18);
  mwrite(mf,dgn->proto,0xf);
  mwrite8(mf,dgn->boneid);
  save_d_flags(mf,dgn->flags);
  mwrite8(mf,dgn->entry_lev);
  mwrite8(mf,dgn->num_dunlevs);
  mwrite8(mf,dgn->dunlev_ureached);
  mwrite32(mf,dgn->ledger_start);
  mwrite32(mf,dgn->depth_start);
  return;
}

Assistant:

static void save_dungeon_struct(struct memfile *mf, const dungeon *dgn)
{
    mtag(mf, dgn->ledger_start, MTAG_DUNGEONSTRUCT);
    mwrite(mf, dgn->dname, sizeof(dgn->dname));
    mwrite(mf, dgn->proto, sizeof(dgn->proto));
    mwrite8(mf, dgn->boneid);
    save_d_flags(mf, dgn->flags);
    mwrite8(mf, dgn->entry_lev);
    mwrite8(mf, dgn->num_dunlevs);
    mwrite8(mf, dgn->dunlev_ureached);
    mwrite32(mf, dgn->ledger_start);
    mwrite32(mf, dgn->depth_start);
}